

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackframe.cpp
# Opt level: O1

void __thiscall
stackjit::StackWalker::visitReferences
          (StackWalker *this,StackFrame *stackFrame,VisitReferenceFn *fn,VisitFrameFn *frameFn)

{
  int iVar1;
  ManagedFunction *pMVar2;
  ExecutionEngine *pEVar3;
  CallStack *pCVar4;
  CallStackEntry *pCVar5;
  CallStackEntry *pCVar6;
  int targetIndex;
  _Any_data *p_Var7;
  StackFrame callStackFrame;
  StackFrame local_88;
  _Any_data local_70;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  
  if ((frameFn->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*frameFn->_M_invoker)((_Any_data *)frameFn,stackFrame);
  }
  p_Var7 = &local_50;
  std::function<void_(stackjit::StackFrameEntry)>::function
            ((function<void_(stackjit::StackFrameEntry)> *)&local_50,fn);
  visitReferencesInFrame((StackWalker *)p_Var7,stackFrame,(VisitReferenceFn *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  pEVar3 = VMState::engine(this->mVMState);
  pCVar4 = ExecutionEngine::callStack(pEVar3);
  pCVar5 = CallStack::top(pCVar4);
  pEVar3 = VMState::engine(this->mVMState);
  pCVar4 = ExecutionEngine::callStack(pEVar3);
  pCVar6 = CallStack::start(pCVar4);
  if (pCVar6 < pCVar5) {
    targetIndex = 0;
    do {
      pMVar2 = pCVar5->function;
      iVar1 = pCVar5->callPoint;
      local_88.mBasePtr = findBasePtr(this,stackFrame->mBasePtr,0,targetIndex);
      local_88.mFunction = pMVar2;
      local_88.mInstructionIndex = iVar1;
      if ((frameFn->super__Function_base)._M_manager != (_Manager_type)0x0) {
        (*frameFn->_M_invoker)((_Any_data *)frameFn,&local_88);
      }
      p_Var7 = &local_70;
      std::function<void_(stackjit::StackFrameEntry)>::function
                ((function<void_(stackjit::StackFrameEntry)> *)&local_70,fn);
      visitReferencesInFrame((StackWalker *)p_Var7,&local_88,(VisitReferenceFn *)&local_70);
      if (local_60 != (code *)0x0) {
        (*local_60)(&local_70,&local_70,__destroy_functor);
      }
      targetIndex = targetIndex + 1;
      pEVar3 = VMState::engine(this->mVMState);
      pCVar4 = ExecutionEngine::callStack(pEVar3);
      pCVar6 = CallStack::start(pCVar4);
      pCVar5 = pCVar5 + -1;
    } while (pCVar6 < pCVar5);
  }
  return;
}

Assistant:

void StackWalker::visitReferences(const StackFrame& stackFrame,	VisitReferenceFn fn, VisitFrameFn frameFn) {
		if (frameFn) {
			frameFn(stackFrame);
		}

		//Visit the calling stack frame
		visitReferencesInFrame(stackFrame, fn);

		//Then all other stack frames
		auto topEntryPtr = mVMState.engine().callStack().top();
		int topFuncIndex = 0;
		while (topEntryPtr > mVMState.engine().callStack().start()) {
			auto callEntry = *topEntryPtr;
			auto topFunc = callEntry.function;
			auto callPoint = callEntry.callPoint;
			auto callBasePtr = findBasePtr(stackFrame.basePtr(), 0, topFuncIndex);

			StackFrame callStackFrame(callBasePtr, topFunc, callPoint);
			if (frameFn) {
				frameFn(callStackFrame);
			}

			visitReferencesInFrame(callStackFrame, fn);

			topEntryPtr--;
			topFuncIndex++;
		}
	}